

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O0

void __thiscall hgdb::json::Scope<hgdb::json::VarStmt>::~Scope(Scope<hgdb::json::VarStmt> *this)

{
  Scope<hgdb::json::VarStmt> *this_local;
  
  (this->super_ScopeBase)._vptr_ScopeBase = (_func_int **)&PTR_serialize_0058b750;
  std::__cxx11::string::~string((string *)&this->condition);
  std::__cxx11::string::~string((string *)&this->filename);
  ScopeBase::~ScopeBase(&this->super_ScopeBase);
  return;
}

Assistant:

explicit Scope(uint32_t line) : line_num(line) {}